

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memset.c
# Opt level: O0

int main(void)

{
  undefined8 local_16;
  char s [10];
  
  s[2] = '\0';
  s[3] = '\0';
  s[4] = '\0';
  s[5] = '\0';
  local_16 = 0x7878787878787878;
  s[0] = 'x';
  s[1] = '\0';
  memset(&local_16,0x6f,10);
  if (s[1] != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset.c, line %d - %s\n"
           ,0x21,"s[9] == \'o\'");
  }
  memset(&local_16,0x5f,0);
  if ((char)local_16 != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset.c, line %d - %s\n"
           ,0x23,"s[0] == \'o\'");
  }
  memset(&local_16,0x5f,1);
  if ((char)local_16 != '_') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset.c, line %d - %s\n"
           ,0x25,"s[0] == \'_\'");
  }
  if (local_16._1_1_ != 'o') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memset.c, line %d - %s\n"
           ,0x26,"s[1] == \'o\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xxxxxxxxx";
    TESTCASE( memset( s, 'o', 10 ) == s );
    TESTCASE( s[9] == 'o' );
    TESTCASE( memset( s, '_', ( 0 ) ) == s );
    TESTCASE( s[0] == 'o' );
    TESTCASE( memset( s, '_', 1 ) == s );
    TESTCASE( s[0] == '_' );
    TESTCASE( s[1] == 'o' );
    return TEST_RESULTS;
}